

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void codeVectorCompare(Parse *pParse,Expr *pExpr,int dest,u8 op,u8 p5)

{
  int iVar1;
  int iVar2;
  int r2;
  int r1;
  Expr *pR;
  Expr *pL;
  int regFree2;
  int regFree1;
  int addrDone;
  int iStack_44;
  u8 opx;
  int regRight;
  int regLeft;
  int i;
  int nLeft;
  Expr *pRight;
  Expr *pLeft;
  Vdbe *v;
  u8 p5_local;
  u8 op_local;
  Expr *pEStack_18;
  int dest_local;
  Expr *pExpr_local;
  Parse *pParse_local;
  
  pLeft = (Expr *)pParse->pVdbe;
  pRight = pExpr->pLeft;
  _i = pExpr->pRight;
  v._2_1_ = p5;
  v._3_1_ = op;
  v._4_4_ = dest;
  pEStack_18 = pExpr;
  pExpr_local = (Expr *)pParse;
  regLeft = sqlite3ExprVectorSize(pRight);
  iStack_44 = 0;
  addrDone = 0;
  regFree1._3_1_ = v._3_1_;
  regFree2 = sqlite3VdbeMakeLabel((Parse *)pExpr_local);
  iVar2 = regLeft;
  iVar1 = sqlite3ExprVectorSize(_i);
  if (iVar2 == iVar1) {
    v._2_1_ = v._2_1_ | 0x20;
    if (regFree1._3_1_ == 0x37) {
      regFree1._3_1_ = 0x38;
    }
    if (regFree1._3_1_ == 0x39) {
      regFree1._3_1_ = 0x36;
    }
    iStack_44 = exprCodeSubselect((Parse *)pExpr_local,pRight);
    addrDone = exprCodeSubselect((Parse *)pExpr_local,_i);
    regRight = 0;
    while( true ) {
      pL._4_4_ = 0;
      pL._0_4_ = 0;
      iVar2 = exprVectorRegister((Parse *)pExpr_local,pRight,regRight,iStack_44,&pR,
                                 (int *)((long)&pL + 4));
      iVar1 = exprVectorRegister((Parse *)pExpr_local,_i,regRight,addrDone,(Expr **)&r2,(int *)&pL);
      codeCompare((Parse *)pExpr_local,pR,_r2,(uint)regFree1._3_1_,iVar2,iVar1,v._4_4_,(uint)v._2_1_
                 );
      sqlite3ReleaseTempReg((Parse *)pExpr_local,pL._4_4_);
      sqlite3ReleaseTempReg((Parse *)pExpr_local,(int)pL);
      if (regRight == regLeft + -1) break;
      if (regFree1._3_1_ == 0x35) {
        sqlite3VdbeAddOp2((Vdbe *)pLeft,0x14,v._4_4_,regFree2);
        v._2_1_ = v._2_1_ | 8;
      }
      else if (regFree1._3_1_ == 0x34) {
        sqlite3VdbeAddOp2((Vdbe *)pLeft,0x12,v._4_4_,regFree2);
        v._2_1_ = v._2_1_ | 8;
      }
      else {
        sqlite3VdbeAddOp2((Vdbe *)pLeft,0x3a,0,regFree2);
        if (regRight == regLeft + -2) {
          regFree1._3_1_ = v._3_1_;
        }
      }
      regRight = regRight + 1;
    }
    sqlite3VdbeResolveLabel((Vdbe *)pLeft,regFree2);
  }
  else {
    sqlite3ErrorMsg((Parse *)pExpr_local,"row value misused");
  }
  return;
}

Assistant:

static void codeVectorCompare(
  Parse *pParse,        /* Code generator context */
  Expr *pExpr,          /* The comparison operation */
  int dest,             /* Write results into this register */
  u8 op,                /* Comparison operator */
  u8 p5                 /* SQLITE_NULLEQ or zero */
){
  Vdbe *v = pParse->pVdbe;
  Expr *pLeft = pExpr->pLeft;
  Expr *pRight = pExpr->pRight;
  int nLeft = sqlite3ExprVectorSize(pLeft);
  int i;
  int regLeft = 0;
  int regRight = 0;
  u8 opx = op;
  int addrDone = sqlite3VdbeMakeLabel(pParse);

  if( nLeft!=sqlite3ExprVectorSize(pRight) ){
    sqlite3ErrorMsg(pParse, "row value misused");
    return;
  }
  assert( pExpr->op==TK_EQ || pExpr->op==TK_NE 
       || pExpr->op==TK_IS || pExpr->op==TK_ISNOT 
       || pExpr->op==TK_LT || pExpr->op==TK_GT 
       || pExpr->op==TK_LE || pExpr->op==TK_GE 
  );
  assert( pExpr->op==op || (pExpr->op==TK_IS && op==TK_EQ)
            || (pExpr->op==TK_ISNOT && op==TK_NE) );
  assert( p5==0 || pExpr->op!=op );
  assert( p5==SQLITE_NULLEQ || pExpr->op==op );

  p5 |= SQLITE_STOREP2;
  if( opx==TK_LE ) opx = TK_LT;
  if( opx==TK_GE ) opx = TK_GT;

  regLeft = exprCodeSubselect(pParse, pLeft);
  regRight = exprCodeSubselect(pParse, pRight);

  for(i=0; 1 /*Loop exits by "break"*/; i++){
    int regFree1 = 0, regFree2 = 0;
    Expr *pL, *pR; 
    int r1, r2;
    assert( i>=0 && i<nLeft );
    r1 = exprVectorRegister(pParse, pLeft, i, regLeft, &pL, &regFree1);
    r2 = exprVectorRegister(pParse, pRight, i, regRight, &pR, &regFree2);
    codeCompare(pParse, pL, pR, opx, r1, r2, dest, p5);
    testcase(op==OP_Lt); VdbeCoverageIf(v,op==OP_Lt);
    testcase(op==OP_Le); VdbeCoverageIf(v,op==OP_Le);
    testcase(op==OP_Gt); VdbeCoverageIf(v,op==OP_Gt);
    testcase(op==OP_Ge); VdbeCoverageIf(v,op==OP_Ge);
    testcase(op==OP_Eq); VdbeCoverageIf(v,op==OP_Eq);
    testcase(op==OP_Ne); VdbeCoverageIf(v,op==OP_Ne);
    sqlite3ReleaseTempReg(pParse, regFree1);
    sqlite3ReleaseTempReg(pParse, regFree2);
    if( i==nLeft-1 ){
      break;
    }
    if( opx==TK_EQ ){
      sqlite3VdbeAddOp2(v, OP_IfNot, dest, addrDone); VdbeCoverage(v);
      p5 |= SQLITE_KEEPNULL;
    }else if( opx==TK_NE ){
      sqlite3VdbeAddOp2(v, OP_If, dest, addrDone); VdbeCoverage(v);
      p5 |= SQLITE_KEEPNULL;
    }else{
      assert( op==TK_LT || op==TK_GT || op==TK_LE || op==TK_GE );
      sqlite3VdbeAddOp2(v, OP_ElseNotEq, 0, addrDone);
      VdbeCoverageIf(v, op==TK_LT);
      VdbeCoverageIf(v, op==TK_GT);
      VdbeCoverageIf(v, op==TK_LE);
      VdbeCoverageIf(v, op==TK_GE);
      if( i==nLeft-2 ) opx = op;
    }
  }
  sqlite3VdbeResolveLabel(v, addrDone);
}